

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PClass::InitializeSpecials(PClass *this,void *addr)

{
  pair<const_PType_*,_unsigned_int> *ppVar1;
  ulong uVar2;
  pair<const_PType_*,_unsigned_int> *ppVar3;
  
  if (this->bRuntimeClass == true) {
    if (this->ParentClass == (PClass *)0x0) {
      __assert_fail("ParentClass != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0xc5c,"void PClass::InitializeSpecials(void *) const");
    }
    InitializeSpecials(this->ParentClass,addr);
    uVar2 = (ulong)(this->SpecialInits).Count;
    if (uVar2 != 0) {
      ppVar1 = (this->SpecialInits).Array;
      ppVar3 = ppVar1 + uVar2;
      do {
        (*(ppVar1->first->super_DObject)._vptr_DObject[10])
                  (ppVar1->first,(long)addr + (ulong)ppVar1->second,this->Defaults + ppVar1->second)
        ;
        ppVar1 = ppVar1 + 1;
      } while (ppVar1 != ppVar3);
    }
  }
  return;
}

Assistant:

void PClass::InitializeSpecials(void *addr) const
{
	// Once we reach a native class, we can stop going up the family tree,
	// since native classes handle initialization natively.
	if (!bRuntimeClass)
	{
		return;
	}
	assert(ParentClass != NULL);
	ParentClass->InitializeSpecials(addr);
	for (auto tao : SpecialInits)
	{
		tao.first->InitializeValue((BYTE*)addr + tao.second, Defaults + tao.second);
	}
}